

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAPublicKey.cpp
# Opt level: O1

bool __thiscall DSAPublicKey::deserialise(DSAPublicKey *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dY;
  ByteString dG;
  ByteString dQ;
  ByteString dP;
  ByteString local_b8;
  ByteString local_90;
  ByteString local_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&local_68,serialised);
  ByteString::chainDeserialise(&local_90,serialised);
  ByteString::chainDeserialise(&local_b8,serialised);
  sVar1 = ByteString::size(&local_40);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&local_68);
    if (sVar1 != 0) {
      sVar1 = ByteString::size(&local_90);
      if (sVar1 != 0) {
        sVar1 = ByteString::size(&local_b8);
        if (sVar1 != 0) {
          (**(code **)(*(long *)this + 0x30))(this,&local_40);
          (**(code **)(*(long *)this + 0x38))(this,&local_68);
          (**(code **)(*(long *)this + 0x40))(this,&local_90);
          bVar2 = true;
          (**(code **)(*(long *)this + 0x48))(this,&local_b8);
          goto LAB_0014fb9d;
        }
      }
    }
  }
  bVar2 = false;
LAB_0014fb9d:
  local_b8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_b8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_90._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_90.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_68._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_68.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_40.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return bVar2;
}

Assistant:

bool DSAPublicKey::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dQ = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);
	ByteString dY = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dQ.size() == 0) ||
	    (dG.size() == 0) ||
	    (dY.size() == 0))
	{
		return false;
	}

	setP(dP);
	setQ(dQ);
	setG(dG);
	setY(dY);

	return true;
}